

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O1

void __thiscall OPLmusicFile::OPLmusicFile(OPLmusicFile *this,FileReader *reader)

{
  int *piVar1;
  char cVar2;
  OPLio *pOVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  BYTE *pBVar7;
  undefined4 extraout_var;
  int i;
  int *piVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_006f3b98;
  iVar6 = (int)reader->Length;
  this->ScoreLen = iVar6;
  if ((this->super_OPLmusicBlock).super_musicBlock.io == (OPLio *)0x0) {
    return;
  }
  pBVar7 = (BYTE *)operator_new__((long)iVar6);
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = pBVar7;
  iVar6 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar7,(long)iVar6);
  if (CONCAT44(extraout_var,iVar6) == (long)this->ScoreLen) {
    pOVar3 = (this->super_OPLmusicBlock).super_musicBlock.io;
    iVar6 = (*pOVar3->_vptr_OPLio[2])(pOVar3,(ulong)(uint)(this->super_OPLmusicBlock).NumChips,0,0);
    (this->super_OPLmusicBlock).NumChips = iVar6;
    if (iVar6 != 0) {
      piVar4 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
      iVar6 = *piVar4;
      if (iVar6 == 0x41524244) {
        if (piVar4[1] != 0x4c504f57) goto LAB_00333b28;
        if (*(short *)((long)piVar4 + 10) == 1) {
          this->RawPlayer = DosBox1;
          (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
          iVar6 = this->ScoreLen + -0x18;
          if (piVar4[4] <= iVar6) {
            iVar6 = piVar4[4];
          }
          iVar6 = iVar6 + 0x18;
        }
        else {
          if (piVar4[2] != 2) {
            Printf("Unsupported DOSBox Raw OPL version %d.%d\n",(ulong)*(ushort *)(piVar4 + 2));
            goto LAB_00333b28;
          }
          cVar2 = *(char *)((long)piVar4 + 0x15);
          if (cVar2 != '\0') {
            Printf("Unsupported DOSBox Raw OPL format %d\n",(ulong)*(byte *)(piVar4 + 5));
          }
          pBVar7 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
          if (pBVar7[0x16] != '\0') {
            Printf("Unsupported DOSBox Raw OPL compression %d\n",(ulong)pBVar7[0x15]);
            goto LAB_00333b28;
          }
          if (cVar2 != '\0') goto LAB_00333b28;
          this->RawPlayer = DosBox2;
          (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
          iVar10 = this->ScoreLen - (pBVar7[0x19] + 0x1a);
          iVar6 = *(int *)(pBVar7 + 0xc) * 2;
          if (iVar10 < *(int *)(pBVar7 + 0xc) * 2) {
            iVar6 = iVar10;
          }
          iVar6 = iVar6 + (uint)pBVar7[0x19] + 0x1a;
        }
        this->ScoreLen = iVar6;
LAB_00333b0b:
        (*(this->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])(this);
        return;
      }
      if (iVar6 == 0x494c4441) {
        if (((char)piVar4[1] == 'B') && (*(char *)((long)piVar4 + 5) == '\x01')) {
          iVar6 = this->ScoreLen;
          piVar1 = (int *)((long)piVar4 + (long)iVar6);
          this->RawPlayer = IMF;
          (this->super_OPLmusicBlock).SamplesPerTick = 71.02285714285715;
          (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)((long)piVar4 + 6);
          iVar10 = 2;
          piVar11 = (int *)((long)piVar4 + 6);
LAB_00333a5e:
          do {
            piVar8 = piVar11;
            if (piVar11 < piVar1) {
              piVar8 = (int *)((long)piVar11 + 1);
              (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)piVar8;
              iVar5 = *piVar11;
              piVar11 = piVar8;
              if ((char)iVar5 != '\0') goto LAB_00333a5e;
            }
            iVar10 = iVar10 + -1;
            piVar11 = piVar8;
          } while (iVar10 != 0);
          piVar11 = (int *)(this->super_OPLmusicBlock).super_musicBlock.score;
          if (piVar11 < piVar1) {
            (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)((long)piVar11 + 1);
          }
          piVar11 = (int *)(this->super_OPLmusicBlock).super_musicBlock.score;
          if (piVar1 < piVar11 + 2) {
            operator_delete__(piVar4);
            (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
          }
          else if ((long)*piVar11 != 0) {
            lVar9 = (long)*piVar11 + 4;
            if (lVar9 < (long)iVar6 - ((long)piVar11 - (long)piVar4)) {
              this->ScoreLen = (int)((long)piVar11 - (long)piVar4) + (int)lVar9;
            }
          }
          if (piVar1 < piVar11 + 2) {
            return;
          }
          goto LAB_00333b0b;
        }
      }
      else if ((iVar6 == 0x41574152) && (piVar4[1] == 0x41544144)) {
        this->RawPlayer = RDosPlay;
        if ((short)piVar4[2] == 0) {
          *(undefined2 *)(piVar4 + 2) = 0xffff;
        }
        (this->super_OPLmusicBlock).SamplesPerTick =
             (double)*(ushort *)(piVar4 + 2) * 0.041666666666666664;
        goto LAB_00333b0b;
      }
    }
  }
LAB_00333b28:
  pBVar7 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
  if (pBVar7 != (BYTE *)0x0) {
    operator_delete__(pBVar7);
  }
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
  return;
}

Assistant:

OPLmusicFile::OPLmusicFile (FileReader *reader)
	: ScoreLen (reader->GetLength())
{
	if (io == NULL)
	{
		return;
	}

	scoredata = new BYTE[ScoreLen];

    if (reader->Read(scoredata, ScoreLen) != ScoreLen)
    {
fail:	delete[] scoredata;
        scoredata = NULL;
        return;
    }

	if (0 == (NumChips = io->OPLinit(NumChips)))
	{
		goto fail;
	}

	// Check for RDosPlay raw OPL format
	if (((DWORD *)scoredata)[0] == MAKE_ID('R','A','W','A') &&
			 ((DWORD *)scoredata)[1] == MAKE_ID('D','A','T','A'))
	{
		RawPlayer = RDosPlay;
		if (*(WORD *)(scoredata + 8) == 0)
		{ // A clock speed of 0 is bad
			*(WORD *)(scoredata + 8) = 0xFFFF; 
		}
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
	}
	// Check for DosBox OPL dump
	else if (((DWORD *)scoredata)[0] == MAKE_ID('D','B','R','A') &&
		((DWORD *)scoredata)[1] == MAKE_ID('W','O','P','L'))
	{
		if (LittleShort(((WORD *)scoredata)[5]) == 1)
		{
			RawPlayer = DosBox1;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			ScoreLen = MIN<int>(ScoreLen - 24, LittleLong(((DWORD *)scoredata)[4])) + 24;
		}
		else if (((DWORD *)scoredata)[2] == MAKE_ID(2,0,0,0))
		{
			bool okay = true;
			if (scoredata[21] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL format %d\n", scoredata[20]);
				okay = false;
			}
			if (scoredata[22] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL compression %d\n", scoredata[21]);
				okay = false;
			}
			if (!okay)
				goto fail;
			RawPlayer = DosBox2;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			int headersize = 0x1A + scoredata[0x19];
			ScoreLen = MIN<int>(ScoreLen - headersize, LittleLong(((DWORD *)scoredata)[3]) * 2) + headersize;
		}
		else
		{
			Printf("Unsupported DOSBox Raw OPL version %d.%d\n", LittleShort(((WORD *)scoredata)[4]), LittleShort(((WORD *)scoredata)[5]));
			goto fail;
		}
	}
	// Check for modified IMF format (includes a header)
	else if (((DWORD *)scoredata)[0] == MAKE_ID('A','D','L','I') &&
		     scoredata[4] == 'B' && scoredata[5] == 1)
	{
		int songlen;
		BYTE *max = scoredata + ScoreLen;
		RawPlayer = IMF;
		SamplesPerTick = OPL_SAMPLE_RATE / IMF_RATE;

		score = scoredata + 6;
		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (score < max && *score++ != '\0') {}
		}
		if (score < max) score++;	// Skip unknown byte
		if (score + 8 > max)
		{ // Not enough room left for song data
			delete[] scoredata;
			scoredata = NULL;
			return;
		}
		songlen = LittleLong(*(DWORD *)score);
		if (songlen != 0 && (songlen +=4) < ScoreLen - (score - scoredata))
		{
			ScoreLen = songlen + int(score - scoredata);
		}
	}
	else
	{
		goto fail;
	}

	Restart ();
}